

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall gl4cts::GPUShaderFP64Test10::prepareTypes(GPUShaderFP64Test10 *this)

{
  typeDetails local_290;
  typeDetails local_260;
  typeDetails local_230;
  typeDetails local_200;
  typeDetails local_1d0;
  typeDetails local_1a0;
  typeDetails local_170;
  typeDetails local_140;
  typeDetails local_110;
  typeDetails local_e0;
  typeDetails local_b0;
  typeDetails local_80;
  typeDetails local_40;
  GPUShaderFP64Test10 *local_10;
  GPUShaderFP64Test10 *this_local;
  
  local_10 = this;
  typeDetails::typeDetails(&local_40,1,1);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_40);
  typeDetails::~typeDetails(&local_40);
  typeDetails::typeDetails(&local_80,1,2);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_80);
  typeDetails::~typeDetails(&local_80);
  typeDetails::typeDetails(&local_b0,1,3);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_b0);
  typeDetails::~typeDetails(&local_b0);
  typeDetails::typeDetails(&local_e0,1,4);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_e0);
  typeDetails::~typeDetails(&local_e0);
  typeDetails::typeDetails(&local_110,2,2);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_110);
  typeDetails::~typeDetails(&local_110);
  typeDetails::typeDetails(&local_140,2,3);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_140);
  typeDetails::~typeDetails(&local_140);
  typeDetails::typeDetails(&local_170,2,4);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_170);
  typeDetails::~typeDetails(&local_170);
  typeDetails::typeDetails(&local_1a0,3,2);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_1a0);
  typeDetails::~typeDetails(&local_1a0);
  typeDetails::typeDetails(&local_1d0,3,3);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_1d0);
  typeDetails::~typeDetails(&local_1d0);
  typeDetails::typeDetails(&local_200,3,4);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_200);
  typeDetails::~typeDetails(&local_200);
  typeDetails::typeDetails(&local_230,4,2);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_230);
  typeDetails::~typeDetails(&local_230);
  typeDetails::typeDetails(&local_260,4,3);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_260);
  typeDetails::~typeDetails(&local_260);
  typeDetails::typeDetails(&local_290,4,4);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::push_back(&this->m_types,&local_290);
  typeDetails::~typeDetails(&local_290);
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareTypes()
{
	m_types.push_back(typeDetails(1 /* n_columns */, 1 /* n_rows */));
	m_types.push_back(typeDetails(1 /* n_columns */, 2 /* n_rows */));
	m_types.push_back(typeDetails(1 /* n_columns */, 3 /* n_rows */));
	m_types.push_back(typeDetails(1 /* n_columns */, 4 /* n_rows */));
	m_types.push_back(typeDetails(2 /* n_columns */, 2 /* n_rows */));
	m_types.push_back(typeDetails(2 /* n_columns */, 3 /* n_rows */));
	m_types.push_back(typeDetails(2 /* n_columns */, 4 /* n_rows */));
	m_types.push_back(typeDetails(3 /* n_columns */, 2 /* n_rows */));
	m_types.push_back(typeDetails(3 /* n_columns */, 3 /* n_rows */));
	m_types.push_back(typeDetails(3 /* n_columns */, 4 /* n_rows */));
	m_types.push_back(typeDetails(4 /* n_columns */, 2 /* n_rows */));
	m_types.push_back(typeDetails(4 /* n_columns */, 3 /* n_rows */));
	m_types.push_back(typeDetails(4 /* n_columns */, 4 /* n_rows */));
}